

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::saveSettings(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  Ui_QFileDialog *pUVar1;
  long lVar2;
  int iVar3;
  QHeaderView *this_01;
  Type *pTVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *this_02;
  QString *path;
  long in_FS_OFFSET;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QLatin1String QVar16;
  QLatin1String QVar17;
  undefined1 local_c0 [16];
  QArrayDataPointer<QString> local_a8;
  QArrayDataPointer<QString> local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = (QArrayData *)0x0;
  local_58._8_8_ = L"QtProject";
  local_58._16_8_ = 9;
  local_88.size = 0;
  local_88.d = (Data *)0x0;
  local_88.ptr = (QString *)0x0;
  QSettings::QSettings
            ((QSettings *)&local_68,UserScope,(QString *)local_58,(QString *)&local_88,
             (QObject *)0x0);
  if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  QVar8.m_size = (size_t)"FileDialog";
  QVar8.field_0.m_data = &local_68;
  QSettings::beginGroup(QVar8);
  pUVar1 = (this->qFileDialogUi).d;
  if (pUVar1 != (Ui_QFileDialog *)0x0 && (this->super_QDialogPrivate).nativeDialogInUse == false) {
    QSplitter::sizes((QList<int> *)&local_88,pUVar1->splitter);
    ::QVariant::QVariant((QVariant *)local_58,*(int *)&((local_88.ptr)->d).d);
    QVar9.m_size = (size_t)"sidebarWidth";
    QVar9.field_0.m_data = &local_68;
    QSettings::setValue(QVar9,(QVariant *)0xc);
    ::QVariant::~QVariant((QVariant *)local_58);
    if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d)->super_QArrayData,4,0x10);
      }
    }
    QUrlModel::urls((QList<QUrl> *)&local_a8,((this->qFileDialogUi).d)->sidebar->urlModel);
    QUrl::toStringList(&local_88,&local_a8,0);
    ::QVariant::QVariant((QVariant *)local_58,(QList_conflict *)&local_88);
    QVar10.m_size = (size_t)"shortcuts";
    QVar10.field_0.m_data = &local_68;
    QSettings::setValue(QVar10,(QVariant *)0x9);
    ::QVariant::~QVariant((QVariant *)local_58);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_a8);
    this_01 = QTreeView::header(&((this->qFileDialogUi).d)->treeView->super_QTreeView);
    QHeaderView::saveState((QByteArray *)&local_88,this_01);
    ::QVariant::QVariant((QVariant *)local_58,(QByteArray *)&local_88);
    QVar11.m_size = (size_t)"treeViewHeader";
    QVar11.field_0.m_data = &local_68;
    QSettings::setValue(QVar11,(QVariant *)0xe);
    ::QVariant::~QVariant((QVariant *)local_58);
    if (&(local_88.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.d)->super_QArrayData,1,0x10);
      }
    }
  }
  local_88.d = (Data *)0x0;
  local_88.ptr = (QString *)0x0;
  local_88.size = 0;
  local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  QFileDialog::history((QStringList *)&local_a8,this_00);
  QList<QString>::reserve((QList<QString> *)&local_88,local_a8.size);
  if ((undefined1 *)local_a8.size != (undefined1 *)0x0) {
    lVar7 = local_a8.size * 0x18;
    do {
      QUrl::fromLocalFile((QString *)local_c0);
      QUrl::toString((QString *)local_58,(QUrl *)local_c0,0);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_88,local_88.size,(QString *)local_58);
      QList<QString>::end((QList<QString> *)&local_88);
      if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
        UNLOCK();
        if (*(int *)local_58._0_8_ == 0) {
          QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
        }
      }
      QUrl::~QUrl((QUrl *)local_c0);
      lVar7 = lVar7 + -0x18;
    } while (lVar7 != 0);
  }
  this_02 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_> *)
            local_58;
  ::QVariant::QVariant((QVariant *)this_02,(QList_conflict *)&local_88);
  QVar12.m_size = (size_t)"history";
  QVar12.field_0.m_data = &local_68;
  QSettings::setValue(QVar12,(QVariant *)0x7);
  ::QVariant::~QVariant((QVariant *)this_02);
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_lastVisitedDir>_>::
           operator()(this_02);
  QUrl::toString(local_c0,pTVar4,0);
  ::QVariant::QVariant((QVariant *)local_58,(QString *)local_c0);
  QVar13.m_size = (size_t)"lastVisited";
  QVar13.field_0.m_data = &local_68;
  QSettings::setValue(QVar13,(QVariant *)&DAT_0000000b);
  ::QVariant::~QVariant((QVariant *)local_58);
  if ((QArrayData *)local_c0._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_c0._0_8_ = *(int *)local_c0._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_c0._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_c0._0_8_,2,0x10);
    }
  }
  iVar3 = (*(code *)**(undefined8 **)&(this_00->super_QDialog).super_QWidget)(this_00);
  pcVar5 = (char *)(*(code *)**(undefined8 **)&(this_00->super_QDialog).super_QWidget)(this_00);
  QMetaObject::indexOfEnumerator(pcVar5);
  local_c0 = QMetaObject::enumerator(iVar3);
  QFileDialog::viewMode(this_00);
  pcVar5 = (char *)QMetaEnum::key((int)local_c0);
  if (pcVar5 == (char *)0x0) {
    lVar7 = 0;
  }
  else {
    lVar6 = -1;
    do {
      lVar7 = lVar6 + 1;
      lVar2 = lVar6 + 1;
      lVar6 = lVar7;
    } while (pcVar5[lVar2] != '\0');
  }
  QVar16.m_data = pcVar5;
  QVar16.m_size = lVar7;
  ::QVariant::QVariant((QVariant *)local_58,QVar16);
  QVar14.m_size = (size_t)"viewMode";
  QVar14.field_0.m_data_utf8 = (char *)&local_68;
  QSettings::setValue(QVar14,(QVariant *)0x8);
  ::QVariant::~QVariant((QVariant *)local_58);
  QVar17.m_data = "6.10.0";
  QVar17.m_size = 6;
  ::QVariant::QVariant((QVariant *)local_58,QVar17);
  QVar15.m_size = (size_t)"qtVersion";
  QVar15.field_0.m_data_utf8 = (char *)&local_68;
  QSettings::setValue(QVar15,(QVariant *)0x9);
  ::QVariant::~QVariant((QVariant *)local_58);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_a8);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_88);
  QSettings::~QSettings((QSettings *)&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::saveSettings()
{
    Q_Q(QFileDialog);
    QSettings settings(QSettings::UserScope, u"QtProject"_s);
    settings.beginGroup("FileDialog");

    if (usingWidgets()) {
        settings.setValue("sidebarWidth", qFileDialogUi->splitter->sizes().constFirst());
        settings.setValue("shortcuts", QUrl::toStringList(qFileDialogUi->sidebar->urls()));
        settings.setValue("treeViewHeader", qFileDialogUi->treeView->header()->saveState());
    }
    QStringList historyUrls;
    const QStringList history = q->history();
    historyUrls.reserve(history.size());
    for (const QString &path : history)
        historyUrls << QUrl::fromLocalFile(path).toString();
    settings.setValue("history", historyUrls);
    settings.setValue("lastVisited", lastVisitedDir()->toString());
    const QMetaEnum &viewModeMeta = q->metaObject()->enumerator(q->metaObject()->indexOfEnumerator("ViewMode"));
    settings.setValue("viewMode", QLatin1StringView(viewModeMeta.key(q->viewMode())));
    settings.setValue("qtVersion", QT_VERSION_STR ""_L1);
}